

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV __thiscall
SoftHSM::AsymSignInit
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_MECHANISM_PTR pMechanism,
          CK_OBJECT_HANDLE hKey)

{
  CK_MECHANISM_TYPE CVar1;
  long lVar2;
  long *plVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  Session *this_00;
  Token *pTVar7;
  OSObject *key;
  CK_STATE sessionState;
  CK_RV CVar8;
  CryptoFactory *pCVar9;
  SoftHSM *inAsymmetricCryptoOp;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  _func_int **pp_Var10;
  SoftHSM *pSVar11;
  char *format;
  undefined4 uVar12;
  CK_RV CStack_80;
  undefined8 *local_70;
  size_t local_68;
  RSAPrivateKey *local_60;
  Type local_54;
  undefined8 local_48;
  long local_40;
  Token *local_38;
  undefined4 extraout_var;
  
  if (this->isInitialised != true) {
    return 400;
  }
  if (pMechanism == (CK_MECHANISM_PTR)0x0) {
    return 7;
  }
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  iVar5 = Session::getOpType(this_00);
  if (iVar5 != 0) {
    return 0x90;
  }
  pTVar7 = Session::getToken(this_00);
  if (pTVar7 == (Token *)0x0) goto LAB_001355ec;
  key = (OSObject *)HandleManager::getObject(this->handleManager,hKey);
  if (key == (OSObject *)0x0) {
    return 0x82;
  }
  iVar5 = (*key->_vptr_OSObject[10])(key);
  if ((char)iVar5 == '\0') {
    return 0x82;
  }
  local_38 = pTVar7;
  iVar5 = (*key->_vptr_OSObject[4])(key,1,0);
  iVar6 = (*key->_vptr_OSObject[4])(key,2,1);
  sessionState = Session::getState(this_00);
  CVar8 = haveRead(sessionState,(CK_BBOOL)iVar5,(CK_BBOOL)iVar6);
  if (CVar8 != 0) {
    if (CVar8 == 0x101) {
      softHSMLog(6,"AsymSignInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0x1011,"User is not authorized");
      return 0x101;
    }
    return CVar8;
  }
  uVar12 = 1;
  local_70 = (undefined8 *)0x1;
  iVar5 = (*key->_vptr_OSObject[4])(key,0x108,0);
  if ((char)iVar5 == '\0') {
    return 0x68;
  }
  bVar4 = isMechanismPermitted(this,key,pMechanism);
  if (!bVar4) {
    return 0x70;
  }
  CVar1 = pMechanism->mechanism;
  CStack_80 = 0x70;
  bVar4 = false;
  switch(CVar1) {
  case 1:
    local_54 = RSA_PKCS;
    goto LAB_0013556a;
  case 2:
  case 4:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xf:
  case 0x10:
    goto switchD_0013512e_caseD_2;
  case 3:
    local_54 = RSA;
    local_70 = (undefined8 *)0x0;
    local_68 = 0;
    goto LAB_0013520b;
  case 5:
    bVar4 = true;
    local_54 = RSA_MD5_PKCS;
    goto LAB_0013556a;
  case 6:
    bVar4 = true;
    local_54 = RSA_SHA1_PKCS;
    goto LAB_0013556a;
  case 0xd:
    plVar3 = (long *)pMechanism->pParameter;
    if ((plVar3 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) {
      format = "Invalid RSA-PSS parameters";
      iVar5 = 0x105c;
LAB_001357b9:
      softHSMLog(3,"AsymSignInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,iVar5,format);
      return 7;
    }
    lVar2 = *plVar3;
    if (lVar2 == 0x270) {
      local_48._0_4_ = 6;
      local_70 = (undefined8 *)0x4;
      uVar12 = 5;
    }
    else if (lVar2 == 0x250) {
      local_48._0_4_ = 4;
      local_70 = (undefined8 *)0x2;
      uVar12 = 3;
    }
    else if (lVar2 == 0x255) {
      local_48._0_4_ = 3;
      local_70 = (undefined8 *)0x5;
      uVar12 = 2;
    }
    else if (lVar2 == 0x260) {
      local_48._0_4_ = 5;
      local_70 = (undefined8 *)0x3;
      uVar12 = 4;
    }
    else {
      if (lVar2 != 0x220) {
        format = "Invalid RSA-PSS hash";
        iVar5 = 0x107d;
        goto LAB_001357b9;
      }
      local_48._0_4_ = 2;
    }
    local_48 = CONCAT44(uVar12,(undefined4)local_48);
    if ((undefined8 *)plVar3[1] != local_70) {
      format = "Hash and MGF don\'t match";
      iVar5 = 0x1082;
      goto LAB_001357b9;
    }
    local_40 = plVar3[2];
    local_70 = &local_48;
    local_68 = 0x10;
    local_54 = RSA_PKCS_PSS;
LAB_0013520b:
    bVar4 = false;
    goto LAB_0013557e;
  case 0xe:
    plVar3 = (long *)pMechanism->pParameter;
    if (((plVar3 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) ||
       ((*plVar3 != 0x220 || (plVar3[1] != 1)))) {
      format = "Invalid parameters";
      iVar5 = 0x1093;
      goto LAB_001357b9;
    }
    local_48 = 0x100000002;
    local_40 = plVar3[2];
    local_54 = RSA_SHA1_PKCS_PSS;
    goto LAB_00135561;
  case 0x11:
    local_54 = DSA;
    bVar4 = false;
    break;
  case 0x12:
    local_54 = DSA_SHA1;
    bVar4 = true;
    break;
  case 0x13:
    local_54 = DSA_SHA224;
    bVar4 = true;
    break;
  case 0x14:
    local_54 = DSA_SHA256;
    bVar4 = true;
    break;
  case 0x15:
    local_54 = DSA_SHA384;
    bVar4 = true;
    break;
  case 0x16:
    local_54 = DSA_SHA512;
    bVar4 = true;
    break;
  default:
    switch(CVar1) {
    case 0x40:
      bVar4 = true;
      local_54 = RSA_SHA256_PKCS;
      break;
    case 0x41:
      bVar4 = true;
      local_54 = RSA_SHA384_PKCS;
      break;
    case 0x42:
      bVar4 = true;
      local_54 = RSA_SHA512_PKCS;
      break;
    case 0x43:
      plVar3 = (long *)pMechanism->pParameter;
      if ((((plVar3 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) || (*plVar3 != 0x250))
         || (plVar3[1] != 2)) {
        format = "Invalid parameters";
        iVar5 = 0x10b7;
        goto LAB_001357b9;
      }
      local_48 = 0x300000004;
      local_40 = plVar3[2];
      local_54 = RSA_SHA256_PKCS_PSS;
      goto LAB_00135561;
    case 0x44:
      plVar3 = (long *)pMechanism->pParameter;
      if (((plVar3 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) ||
         ((*plVar3 != 0x260 || (plVar3[1] != 3)))) {
        format = "Invalid parameters";
        iVar5 = 0x10c9;
        goto LAB_001357b9;
      }
      local_48 = 0x400000005;
      local_40 = plVar3[2];
      local_54 = RSA_SHA384_PKCS_PSS;
      goto LAB_00135561;
    case 0x45:
      plVar3 = (long *)pMechanism->pParameter;
      if (((plVar3 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) ||
         ((*plVar3 != 0x270 || (plVar3[1] != 4)))) {
        format = "Invalid parameters";
        iVar5 = 0x10db;
        goto LAB_001357b9;
      }
      local_48 = 0x500000006;
      local_40 = plVar3[2];
      local_54 = RSA_SHA512_PKCS_PSS;
      goto LAB_00135561;
    case 0x46:
      bVar4 = true;
      local_54 = RSA_SHA224_PKCS;
      break;
    case 0x47:
      plVar3 = (long *)pMechanism->pParameter;
      if ((((plVar3 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) || (*plVar3 != 0x255))
         || (plVar3[1] != 5)) {
        format = "Invalid parameters";
        iVar5 = 0x10a5;
        goto LAB_001357b9;
      }
      local_48 = 0x200000003;
      local_40 = plVar3[2];
      local_54 = RSA_SHA224_PKCS_PSS;
LAB_00135561:
      local_70 = &local_48;
      local_68 = 0x10;
      bVar4 = true;
      goto LAB_0013557e;
    default:
      if (CVar1 != 0x1041) {
        if (CVar1 != 0x1057) {
          return 0x70;
        }
        pCVar9 = CryptoFactory::i();
        iVar5 = (*pCVar9->_vptr_CryptoFactory[2])(pCVar9,7);
        inAsymmetricCryptoOp = (SoftHSM *)CONCAT44(extraout_var,iVar5);
        if (inAsymmetricCryptoOp == (SoftHSM *)0x0) {
          return 0x70;
        }
        pSVar11 = inAsymmetricCryptoOp;
        iVar5 = (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x16])();
        local_60 = (RSAPrivateKey *)CONCAT44(extraout_var_00,iVar5);
        if (local_60 == (RSAPrivateKey *)0x0) goto LAB_001355f3;
        CVar8 = getEDPrivateKey(pSVar11,(EDPrivateKey *)local_60,local_38,key);
        if (CVar8 == 0) {
          local_54 = EDDSA;
          goto LAB_001353b8;
        }
        goto LAB_0013527d;
      }
      pCVar9 = CryptoFactory::i();
      iVar5 = (*pCVar9->_vptr_CryptoFactory[2])(pCVar9,5);
      inAsymmetricCryptoOp = (SoftHSM *)CONCAT44(extraout_var_03,iVar5);
      if (inAsymmetricCryptoOp == (SoftHSM *)0x0) {
        return 0x70;
      }
      pSVar11 = inAsymmetricCryptoOp;
      iVar5 = (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x16])();
      local_60 = (RSAPrivateKey *)CONCAT44(extraout_var_04,iVar5);
      if (local_60 == (RSAPrivateKey *)0x0) goto LAB_001355f3;
      CVar8 = getECPrivateKey(pSVar11,(ECPrivateKey *)local_60,local_38,key);
      if (CVar8 != 0) goto LAB_0013527d;
      local_54 = ECDSA;
LAB_001353b8:
      local_70 = (undefined8 *)0x0;
      local_68 = 0;
      goto LAB_0013569c;
    }
LAB_0013556a:
    local_70 = (undefined8 *)0x0;
    local_68 = 0;
LAB_0013557e:
    pCVar9 = CryptoFactory::i();
    iVar5 = (*pCVar9->_vptr_CryptoFactory[2])(pCVar9,1);
    inAsymmetricCryptoOp = (SoftHSM *)CONCAT44(extraout_var_05,iVar5);
    if (inAsymmetricCryptoOp == (SoftHSM *)0x0) {
      return 0x70;
    }
    pSVar11 = inAsymmetricCryptoOp;
    iVar5 = (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x16])();
    local_60 = (RSAPrivateKey *)CONCAT44(extraout_var_06,iVar5);
    if (local_60 == (RSAPrivateKey *)0x0) goto LAB_001355f3;
    CVar8 = getRSAPrivateKey(pSVar11,local_60,local_38,key);
    if (CVar8 == 0) goto LAB_0013564b;
    pp_Var10 = inAsymmetricCryptoOp->_vptr_SoftHSM;
    goto LAB_001355d5;
  }
  pCVar9 = CryptoFactory::i();
  iVar5 = (*pCVar9->_vptr_CryptoFactory[2])(pCVar9,2);
  inAsymmetricCryptoOp = (SoftHSM *)CONCAT44(extraout_var_01,iVar5);
  if (inAsymmetricCryptoOp != (SoftHSM *)0x0) {
    pSVar11 = inAsymmetricCryptoOp;
    iVar5 = (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x16])();
    local_60 = (RSAPrivateKey *)CONCAT44(extraout_var_02,iVar5);
    if (local_60 == (RSAPrivateKey *)0x0) {
LAB_001355f3:
      pCVar9 = CryptoFactory::i();
      (*pCVar9->_vptr_CryptoFactory[3])(pCVar9,inAsymmetricCryptoOp);
      CStack_80 = 2;
    }
    else {
      CVar8 = getDSAPrivateKey(pSVar11,(DSAPrivateKey *)local_60,local_38,key);
      if (CVar8 == 0) {
        local_68 = 0;
        local_70 = (undefined8 *)0x0;
LAB_0013564b:
        if (bVar4) {
          iVar5 = (*inAsymmetricCryptoOp->_vptr_SoftHSM[3])
                            (inAsymmetricCryptoOp,local_60,(ulong)local_54,local_70,local_68);
          bVar4 = true;
          if ((char)iVar5 == '\0') {
            (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x1b])(inAsymmetricCryptoOp,local_60);
            pCVar9 = CryptoFactory::i();
            (*pCVar9->_vptr_CryptoFactory[3])(pCVar9,inAsymmetricCryptoOp);
            return 0x70;
          }
        }
        else {
LAB_0013569c:
          bVar4 = false;
        }
        iVar5 = (*key->_vptr_OSObject[4])(key,0x202,0);
        if ((char)iVar5 != '\0') {
          Session::setReAuthentication(this_00,true);
        }
        Session::setOpType(this_00,5);
        Session::setAsymmetricCryptoOp(this_00,(AsymmetricAlgorithm *)inAsymmetricCryptoOp);
        Session::setMechanism(this_00,local_54);
        Session::setParameters(this_00,local_70,local_68);
        Session::setAllowMultiPartOp(this_00,bVar4);
        Session::setAllowSinglePartOp(this_00,true);
        Session::setPrivateKey(this_00,&local_60->super_PrivateKey);
        CStack_80 = 0;
      }
      else {
LAB_0013527d:
        pp_Var10 = inAsymmetricCryptoOp->_vptr_SoftHSM;
LAB_001355d5:
        (*pp_Var10[0x1b])(inAsymmetricCryptoOp,local_60);
        pCVar9 = CryptoFactory::i();
        (*pCVar9->_vptr_CryptoFactory[3])(pCVar9,inAsymmetricCryptoOp);
LAB_001355ec:
        CStack_80 = 5;
      }
    }
  }
switchD_0013512e_caseD_2:
  return CStack_80;
}

Assistant:

CK_RV SoftHSM::AsymSignInit(CK_SESSION_HANDLE hSession, CK_MECHANISM_PTR pMechanism, CK_OBJECT_HANDLE hKey)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pMechanism == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if we have another operation
	if (session->getOpType() != SESSION_OP_NONE) return CKR_OPERATION_ACTIVE;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL) return CKR_GENERAL_ERROR;

	// Check the key handle.
	OSObject *key = (OSObject *)handleManager->getObject(hKey);
	if (key == NULL_PTR || !key->isValid()) return CKR_OBJECT_HANDLE_INVALID;

	CK_BBOOL isOnToken = key->getBooleanValue(CKA_TOKEN, false);
	CK_BBOOL isPrivate = key->getBooleanValue(CKA_PRIVATE, true);

	// Check read user credentials
	CK_RV rv = haveRead(session->getState(), isOnToken, isPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");

		return rv;
	}

	// Check if key can be used for signing
	if (!key->getBooleanValue(CKA_SIGN, false))
		return CKR_KEY_FUNCTION_NOT_PERMITTED;

	// Check if the specified mechanism is allowed for the key
	if (!isMechanismPermitted(key, pMechanism))
		return CKR_MECHANISM_INVALID;

	// Get the asymmetric algorithm matching the mechanism
	AsymMech::Type mechanism = AsymMech::Unknown;
	void* param = NULL;
	size_t paramLen = 0;
	RSA_PKCS_PSS_PARAMS pssParam;
	bool bAllowMultiPartOp;
	bool isRSA = false;
	bool isDSA = false;
#ifdef WITH_ECC
	bool isECDSA = false;
#endif
#ifdef WITH_EDDSA
	bool isEDDSA = false;
#endif
	switch(pMechanism->mechanism) {
		case CKM_RSA_PKCS:
			mechanism = AsymMech::RSA_PKCS;
			bAllowMultiPartOp = false;
			isRSA = true;
			break;
		case CKM_RSA_X_509:
			mechanism = AsymMech::RSA;
			bAllowMultiPartOp = false;
			isRSA = true;
			break;
#ifndef WITH_FIPS
		case CKM_MD5_RSA_PKCS:
			mechanism = AsymMech::RSA_MD5_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
#endif
		case CKM_SHA1_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA1_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA224_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA224_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA256_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA256_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA384_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA384_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA512_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA512_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
#ifdef WITH_RAW_PSS
		case CKM_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS))
			{
				ERROR_MSG("Invalid RSA-PSS parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_PKCS_PSS;
			unsigned long allowedMgf;

			switch(CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg) {
				case CKM_SHA_1:
					pssParam.hashAlg = HashAlgo::SHA1;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA1;
					allowedMgf = CKG_MGF1_SHA1;
					break;
				case CKM_SHA224:
					pssParam.hashAlg = HashAlgo::SHA224;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA224;
					allowedMgf = CKG_MGF1_SHA224;
					break;
				case CKM_SHA256:
					pssParam.hashAlg = HashAlgo::SHA256;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA256;
					allowedMgf = CKG_MGF1_SHA256;
					break;
				case CKM_SHA384:
					pssParam.hashAlg = HashAlgo::SHA384;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA384;
					allowedMgf = CKG_MGF1_SHA384;
					break;
				case CKM_SHA512:
					pssParam.hashAlg = HashAlgo::SHA512;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA512;
					allowedMgf = CKG_MGF1_SHA512;
					break;
				default:
					ERROR_MSG("Invalid RSA-PSS hash");
					return CKR_ARGUMENTS_BAD;
			}

			if (CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != allowedMgf) {
				ERROR_MSG("Hash and MGF don't match");
				return CKR_ARGUMENTS_BAD;
			}

			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = false;
			isRSA = true;
			break;
#endif
		case CKM_SHA1_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA_1 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA1)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA1_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA1;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA1;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA224_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA224 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA224)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA224_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA224;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA224;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA256_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA256 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA256)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA256_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA256;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA256;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA384_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA384 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA384)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA384_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA384;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA384;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA512_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA512 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA512)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA512_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA512;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA512;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_DSA:
			mechanism = AsymMech::DSA;
			bAllowMultiPartOp = false;
			isDSA = true;
			break;
		case CKM_DSA_SHA1:
			mechanism = AsymMech::DSA_SHA1;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
		case CKM_DSA_SHA224:
			mechanism = AsymMech::DSA_SHA224;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
		case CKM_DSA_SHA256:
			mechanism = AsymMech::DSA_SHA256;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
		case CKM_DSA_SHA384:
			mechanism = AsymMech::DSA_SHA384;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
		case CKM_DSA_SHA512:
			mechanism = AsymMech::DSA_SHA512;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
#ifdef WITH_ECC
		case CKM_ECDSA:
			mechanism = AsymMech::ECDSA;
			bAllowMultiPartOp = false;
			isECDSA = true;
			break;
#endif
#ifdef WITH_GOST
		case CKM_GOSTR3410:
			mechanism = AsymMech::GOST;
			bAllowMultiPartOp = false;
			break;
		case CKM_GOSTR3410_WITH_GOSTR3411:
			mechanism = AsymMech::GOST_GOST;
			bAllowMultiPartOp = true;
			break;
#endif
#ifdef WITH_EDDSA
		case CKM_EDDSA:
			mechanism = AsymMech::EDDSA;
			bAllowMultiPartOp = false;
			isEDDSA = true;
			break;
#endif
		default:
			return CKR_MECHANISM_INVALID;
	}

	AsymmetricAlgorithm* asymCrypto = NULL;
	PrivateKey* privateKey = NULL;
	if (isRSA)
	{
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::RSA);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		privateKey = asymCrypto->newPrivateKey();
		if (privateKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getRSAPrivateKey((RSAPrivateKey*)privateKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePrivateKey(privateKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
	}
	else if (isDSA)
	{
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::DSA);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		privateKey = asymCrypto->newPrivateKey();
		if (privateKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getDSAPrivateKey((DSAPrivateKey*)privateKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePrivateKey(privateKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
        }
#ifdef WITH_ECC
	else if (isECDSA)
	{
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::ECDSA);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		privateKey = asymCrypto->newPrivateKey();
		if (privateKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getECPrivateKey((ECPrivateKey*)privateKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePrivateKey(privateKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
	}
#endif
#ifdef WITH_EDDSA
	else if (isEDDSA)
	{
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::EDDSA);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		privateKey = asymCrypto->newPrivateKey();
		if (privateKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getEDPrivateKey((EDPrivateKey*)privateKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePrivateKey(privateKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
	}
#endif
	else
	{
#ifdef WITH_GOST
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::GOST);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		privateKey = asymCrypto->newPrivateKey();
		if (privateKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getGOSTPrivateKey((GOSTPrivateKey*)privateKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePrivateKey(privateKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
#else
		return CKR_MECHANISM_INVALID;
#endif
        }